

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

string * __thiscall
duckdb::Time::ToUTCOffset_abi_cxx11_
          (string *__return_storage_ptr__,Time *this,int hour_offset,int minute_offset)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char local_e;
  undefined1 local_d;
  char local_c;
  undefined1 local_b;
  undefined1 local_a;
  char local_9;
  
  puVar3 = &stack0xfffffffffffffff8;
  iVar2 = (int)this * 0x3c + hour_offset;
  uVar4 = (long)iVar2 * 60000000;
  local_e = (char)(iVar2 >> 0x1f) * -2 + '+';
  uVar6 = (long)iVar2 * -60000000;
  if (0 < (long)uVar4) {
    uVar6 = uVar4;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar5 = SUB168(auVar1 * ZEXT816(0x98b5bf2c03e529d),8) >> 0x1b;
  uVar4 = (long)(uVar5 * -3600000000 + uVar6) / 60000000;
  if (uVar6 >> 0xb < 0x10c388d) {
    local_d = 0x30;
    local_c = (char)uVar5 + '0';
  }
  else {
    local_d = duckdb_fmt::v6::internal::basic_data<void>::digits[(uVar5 & 0xffffffff) * 2];
    local_c = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)((int)uVar5 * 2) + 1];
  }
  iVar2 = (int)uVar4;
  if (iVar2 == 0) {
    puVar3 = &local_b;
  }
  else {
    local_b = 0x3a;
    if (iVar2 < 10) {
      local_a = 0x30;
      local_9 = (char)uVar4 + '0';
      puVar3 = &stack0xfffffffffffffff8;
    }
    else {
      local_a = duckdb_fmt::v6::internal::basic_data<void>::digits[(uVar4 & 0xffffffff) * 2];
      local_9 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)(iVar2 * 2) + 1];
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,&local_e,puVar3);
  return __return_storage_ptr__;
}

Assistant:

string Time::ToUTCOffset(int hour_offset, int minute_offset) {
	dtime_t time((hour_offset * Interval::MINS_PER_HOUR + minute_offset) * Interval::MICROS_PER_MINUTE);

	char buffer[1 + 2 + 1 + 2];
	idx_t length = 0;
	buffer[length++] = (time.micros < 0 ? '-' : '+');
	time.micros = std::abs(time.micros);

	int32_t time_units[4];
	Time::Convert(time, time_units[0], time_units[1], time_units[2], time_units[3]);

	TimeToStringCast::FormatTwoDigits(buffer + length, time_units[0]);
	length += 2;
	if (time_units[1]) {
		buffer[length++] = ':';
		TimeToStringCast::FormatTwoDigits(buffer + length, time_units[1]);
		length += 2;
	}

	return string(buffer, length);
}